

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmuxgenerator.cpp
# Opt level: O1

string * __thiscall
PortMuxGenerator::extractPortFromString_abi_cxx11_
          (string *__return_storage_ptr__,PortMuxGenerator *this,int muxIndex,int portIndex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer piVar3;
  string *psVar4;
  size_type sVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  string local_a8;
  string *local_88;
  int local_80;
  int local_7c;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar3 = (this->numPorts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->numPorts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  uVar9 = (ulong)muxIndex;
  local_88 = __return_storage_ptr__;
  local_80 = portIndex;
  if (portIndex != 1) {
    if (uVar6 <= uVar9) goto LAB_0010f9b5;
    if (piVar3[uVar9] != portIndex) {
      uVar6 = 0;
      iVar8 = 1;
      local_7c = 0;
      do {
        getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
        sVar5 = local_a8._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (sVar5 <= uVar6) goto LAB_0010f905;
        getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
        if (local_a8._M_string_length <= uVar6) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
        }
        cVar2 = local_a8._M_dataplus._M_p[uVar6];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (cVar2 == ',') {
          if (iVar8 == local_80) goto LAB_0010f895;
          iVar8 = iVar8 + 1;
          local_7c = (int)uVar6 + 1;
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
    iVar8 = 1;
    uVar6 = 0;
    while( true ) {
      getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
      sVar5 = local_a8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (sVar5 <= uVar6) goto LAB_0010f905;
      getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
      if (local_a8._M_string_length <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
      }
      cVar2 = local_a8._M_dataplus._M_p[uVar6];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((cVar2 == ',') && (iVar8 = iVar8 + 1, iVar8 == local_80)) break;
      uVar6 = uVar6 + 1;
    }
    getMuxPorts_abi_cxx11_(&local_78,this,muxIndex);
    getMuxPorts_abi_cxx11_(&local_50,this,muxIndex);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_78);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0010f8e2;
    goto LAB_0010f8ea;
  }
  if (uVar6 <= uVar9) {
LAB_0010f9b5:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  if (piVar3[uVar9] != 1) {
    paVar1 = &local_a8.field_2;
    uVar6 = 0;
    do {
      getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
      sVar5 = local_a8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (sVar5 <= uVar6) goto LAB_0010f905;
      getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
      if (local_a8._M_string_length <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
      }
      cVar2 = local_a8._M_dataplus._M_p[uVar6];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
    } while (cVar2 != ',');
    getMuxPorts_abi_cxx11_(&local_78,this,muxIndex);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_78);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
    local_50.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) goto LAB_0010f8e2;
    goto LAB_0010f8ea;
  }
  getMuxPorts_abi_cxx11_(&local_a8,this,muxIndex);
  std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
  local_78.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
  local_78._M_dataplus._M_p = local_a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_0010f905;
  goto LAB_0010f8fd;
LAB_0010f895:
  getMuxPorts_abi_cxx11_(&local_78,this,muxIndex);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_78);
  std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
  local_50.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0010f8e2:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0010f8ea:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0010f905;
LAB_0010f8fd:
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_0010f905:
  psVar4 = local_88;
  local_a8._M_dataplus._M_p = " ";
  local_a8._M_string_length = 0x11bed4;
  pcVar10 = (local_88->_M_dataplus)._M_p;
  sVar5 = local_88->_M_string_length;
  pcVar7 = pcVar10 + sVar5;
  do {
    pcVar11 = pcVar7;
    if (sVar5 == 0) {
LAB_0010f948:
      if (pcVar11 != pcVar7) {
        boost::algorithm::detail::
        find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                  (local_88);
      }
      return psVar4;
    }
    if (*pcVar10 == ' ') {
      pcVar7 = pcVar10 + 1;
      pcVar11 = pcVar10;
      goto LAB_0010f948;
    }
    pcVar10 = pcVar10 + 1;
    sVar5 = sVar5 - 1;
  } while( true );
}

Assistant:

std::string PortMuxGenerator::extractPortFromString(int muxIndex, int portIndex) {
  std::string port;

  int commasCounter = 1;
  int stringBeginIndex = 0;
  if(portIndex == 1 && getMuxNumPorts(muxIndex) == 1) {
    port = getMuxPorts(muxIndex);
  } else if(portIndex == 1) {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        port = getMuxPorts(muxIndex).substr(0, i);
        break;
      }
    }
  } else if(portIndex == getMuxNumPorts(muxIndex)) {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        commasCounter++;
        stringBeginIndex = i;
        if(commasCounter == portIndex) {
          port = getMuxPorts(muxIndex).substr(i + 1, getMuxPorts(muxIndex).size());
          break;
        }
      }
    }
  } else {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        commasCounter++;
        if(commasCounter == (portIndex + 1)) {
          port = getMuxPorts(muxIndex).substr(stringBeginIndex, (i - stringBeginIndex));
          break;
        } else {
          stringBeginIndex = i + 1;
        }
      }
    }
  }

  boost::erase_all(port, " ");

  return port;
}